

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * absl::strings_internal::CatPieces_abi_cxx11_
                   (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  size_type sVar1;
  const_pointer __src;
  long lVar2;
  string *in_RDI;
  size_t this_size;
  string_view piece_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2_1;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  string_view piece;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2;
  uint64_t total_size;
  uint64_t kMaxSize;
  string *result;
  size_t in_stack_fffffffffffffeb8;
  void *pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  void *pvVar4;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  const_iterator local_f0;
  const_iterator local_e8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *local_e0;
  void *local_d8;
  void *local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  const_iterator local_48;
  const_iterator local_40;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *local_38;
  long local_30;
  undefined8 local_28;
  undefined1 local_19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> local_18;
  
  local_19 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = 0xffffffffffffffff;
  local_30 = 0;
  local_38 = &local_18;
  local_40 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       (local_38);
  local_48 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        in_stack_fffffffffffffec0);
  for (; local_40 != local_48; local_40 = local_40 + 1) {
    local_58._M_len = local_40->_M_len;
    local_58._M_str = local_40->_M_str;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_58);
    local_30 = sVar1 + local_30;
  }
  STLStringResizeUninitialized<std::__cxx11::string,void>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_d8 = (void *)std::__cxx11::string::operator[]((ulong)in_RDI);
  local_e0 = &local_18;
  local_d0 = local_d8;
  local_e8 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       (local_e0);
  local_f0 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        in_stack_fffffffffffffec0);
  for (; local_e8 != local_f0; local_e8 = local_e8 + 1) {
    local_100._M_len = local_e8->_M_len;
    local_100._M_str = local_e8->_M_str;
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_100);
    pvVar3 = local_d8;
    if (sVar1 != 0) {
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_100);
      memcpy(pvVar3,__src,sVar1);
      local_d8 = (void *)(sVar1 + (long)local_d8);
    }
  }
  pvVar3 = local_d0;
  pvVar4 = local_d8;
  lVar2 = std::__cxx11::string::size();
  if (pvVar4 == (void *)((long)pvVar3 + lVar2)) {
    return in_RDI;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0x95,
                "std::string absl::strings_internal::CatPieces(std::initializer_list<absl::string_view>)"
               );
}

Assistant:

std::string CatPieces(std::initializer_list<absl::string_view> pieces) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  uint64_t total_size = 0;
  for (absl::string_view piece : pieces) {
    total_size += piece.size();
  }
  ABSL_INTERNAL_CHECK(total_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(total_size));

  char* const begin = &result[0];
  char* out = begin;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + result.size());
  return result;
}